

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

int archive_read_format_7zip_bid(archive_read *a,int best_bid)

{
  int iVar1;
  uint uVar2;
  ssize_t in_RAX;
  int *__s1;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  char *p;
  bool bVar6;
  ssize_t bytes_avail;
  
  if (best_bid < 0x21) {
    bytes_avail = in_RAX;
    __s1 = (int *)__archive_read_ahead(a,6,(ssize_t *)0x0);
    iVar1 = 0;
    if (__s1 != (int *)0x0) {
      iVar1 = bcmp(__s1,anon_var_dwarf_ca8bb4,6);
      if (iVar1 == 0) {
        iVar1 = 0x30;
      }
      else if ((((char)*__s1 == 'M') && (*(char *)((long)__s1 + 1) == 'Z')) ||
              (iVar1 = 0, *__s1 == 0x464c457f)) {
        lVar5 = 0x27000;
        uVar4 = 0x1000;
        do {
          while( true ) {
            if (0x60000 < (long)(lVar5 + uVar4)) {
              return 0;
            }
            pvVar3 = __archive_read_ahead(a,lVar5 + uVar4,&bytes_avail);
            if (pvVar3 == (void *)0x0) break;
            p = (char *)(lVar5 + (long)pvVar3);
            while (p + 0x20 < (char *)(bytes_avail + (long)pvVar3)) {
              uVar2 = check_7zip_header_in_sfx(p);
              p = p + uVar2;
              if (uVar2 == 0) {
                return 0x30;
              }
            }
            lVar5 = (long)p - (long)pvVar3;
          }
          bVar6 = 0x7f < uVar4;
          uVar4 = uVar4 >> 1;
        } while (bVar6);
        iVar1 = 0;
      }
    }
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int
archive_read_format_7zip_bid(struct archive_read *a, int best_bid)
{
	const char *p;

	/* If someone has already bid more than 32, then avoid
	   trashing the look-ahead buffers with a seek. */
	if (best_bid > 32)
		return (-1);

	if ((p = __archive_read_ahead(a, 6, NULL)) == NULL)
		return (0);

	/* If first six bytes are the 7-Zip signature,
	 * return the bid right now. */
	if (memcmp(p, _7ZIP_SIGNATURE, 6) == 0)
		return (48);

	/*
	 * It may a 7-Zip SFX archive file. If first two bytes are
	 * 'M' and 'Z' available on Windows or first four bytes are
	 * "\x7F\x45LF" available on posix like system, seek the 7-Zip
	 * signature. Although we will perform a seek when reading
	 * a header, what we do not use __archive_read_seek() here is
	 * due to a bidding performance.
	 */
	if ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0) {
		ssize_t offset = SFX_MIN_ADDR;
		ssize_t window = 4096;
		ssize_t bytes_avail;
		while (offset + window <= (SFX_MAX_ADDR)) {
			const char *buff = __archive_read_ahead(a,
					offset + window, &bytes_avail);
			if (buff == NULL) {
				/* Remaining bytes are less than window. */
				window >>= 1;
				if (window < 0x40)
					return (0);
				continue;
			}
			p = buff + offset;
			while (p + 32 < buff + bytes_avail) {
				int step = check_7zip_header_in_sfx(p);
				if (step == 0)
					return (48);
				p += step;
			}
			offset = p - buff;
		}
	}
	return (0);
}